

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_percentile_tables.cpp
# Opt level: O1

bool is_legal_3d_block_size(uint xdim,uint ydim,uint zdim)

{
  uint uVar1;
  
  uVar1 = ydim << 8 | xdim << 0x10 | zdim;
  if ((int)uVar1 < 0x50504) {
    if ((int)uVar1 < 0x40403) {
      if ((uVar1 != 0x30303) && (uVar1 != 0x40303)) {
        return false;
      }
    }
    else if ((1 < uVar1 - 0x40403) && (uVar1 != 0x50404)) {
      return false;
    }
  }
  else if (((1 < uVar1 - 0x50504) && (1 < uVar1 - 0x60605)) && (uVar1 != 0x60505)) {
    return false;
  }
  return true;
}

Assistant:

bool is_legal_3d_block_size(
	unsigned int xdim,
	unsigned int ydim,
	unsigned int zdim
) {
	unsigned int idx = (xdim << 16) | (ydim << 8) | zdim;
	switch (idx)
	{
		case 0x030303:
		case 0x040303:
		case 0x040403:
		case 0x040404:
		case 0x050404:
		case 0x050504:
		case 0x050505:
		case 0x060505:
		case 0x060605:
		case 0x060606:
			return true;
	}

	return false;
}